

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,UntypedMapBase *map,uint32_t tag,
               NodeBase *node,MapAuxInfo map_info)

{
  _func_void_MessageLite_ptr_int_string_view *p_Var1;
  string_view sVar2;
  LogMessage *pLVar3;
  int *piVar4;
  UnknownFieldOps *pUVar5;
  Arena *pAVar6;
  LogMessage local_e0;
  Voidify local_cb;
  MapTypeCard local_ca;
  undefined1 local_c8 [8];
  CodedOutputStream coded_output;
  undefined1 local_68 [8];
  StringOutputStream string_output;
  string serialized;
  NodeBase *node_local;
  uint32_t tag_local;
  UntypedMapBase *map_local;
  TcParseTableBase *table_local;
  MessageLite *msg_local;
  MapAuxInfo map_info_local;
  
  std::__cxx11::string::string((string *)&string_output.target_);
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)local_68,(string *)&string_output.target_);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)local_c8,(StringOutputStream *)local_68);
  msg_local._3_2_ = map_info.key_type_card;
  local_ca = msg_local._3_2_;
  SerializeMapKey(map,node,msg_local._3_2_,(CodedOutputStream *)local_c8);
  if ((map_info._4_1_ >> 4 & 1) != 0) {
    piVar4 = UntypedMapBase::GetValue<int>(map,node);
    WireFormatLite::WriteInt32(2,*piVar4,(CodedOutputStream *)local_c8);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_c8);
    io::StringOutputStream::~StringOutputStream((StringOutputStream *)local_68);
    pUVar5 = GetUnknownFieldOps(table);
    p_Var1 = pUVar5->write_length_delimited;
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&string_output.target_);
    (*p_Var1)(msg,tag >> 3,sVar2);
    pAVar6 = UntypedMapBase::arena(map);
    if (pAVar6 == (Arena *)0x0) {
      UntypedMapBase::DeleteNode(map,node);
    }
    std::__cxx11::string::~string((string *)&string_output.target_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0xa82,"map_info.value_is_validated_enum");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_cb,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e0);
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      UntypedMapBase& map, uint32_t tag,
                                      NodeBase* node, MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(map, node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2, *map.GetValue<int32_t>(node), &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);

  if (map.arena() == nullptr) {
    map.DeleteNode(node);
  }
}